

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData *
cfd::core::Psbt::CreateFixRecordKey
          (ByteData *__return_storage_ptr__,uint8_t type,ByteData *fixed_size_key)

{
  ByteData local_38;
  ByteData *local_20;
  ByteData *fixed_size_key_local;
  ByteData *pBStack_10;
  uint8_t type_local;
  
  local_20 = fixed_size_key;
  fixed_size_key_local._7_1_ = type;
  pBStack_10 = __return_storage_ptr__;
  ByteData::ByteData(&local_38,type);
  ByteData::Concat<cfd::core::ByteData>(__return_storage_ptr__,&local_38,local_20);
  ByteData::~ByteData((ByteData *)0x46e94e);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateFixRecordKey(
    uint8_t type, const ByteData &fixed_size_key) {
  return ByteData(type).Concat(fixed_size_key);
}